

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O2

void __thiscall
BamTools::ResolveTool::ReadNamesFileWriter::Write
          (ReadNamesFileWriter *this,string *readGroupName,string *readName)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)this,(string *)readGroupName);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)readName);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void ResolveTool::ReadNamesFileWriter::Write(const std::string& readGroupName,
                                             const std::string& readName)
{
    m_stream << readGroupName << TAB_CHAR << readName << std::endl;
}